

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall embree::Buffer::Buffer(Buffer *this,Device *device,size_t numBytes_in,void *ptr_in)

{
  char *pcVar1;
  
  (this->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Buffer_021d3f18;
  this->device = device;
  this->numBytes = numBytes_in;
  (*(device->super_State).super_RefCount._vptr_RefCount[2])(device);
  pcVar1 = alloc(this,ptr_in,&this->shared,USM_SHARED);
  this->ptr = pcVar1;
  return;
}

Assistant:

Buffer(Device* device, size_t numBytes_in, void* ptr_in)
      : device(device), numBytes(numBytes_in)
    {
      device->refInc();

      ptr = alloc(ptr_in, shared, EmbreeMemoryType::USM_SHARED);
#if defined(EMBREE_SYCL_SUPPORT)
      dshared = true;
      dptr = ptr;
      modified = true;
#endif
    }